

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::FeatureSetDefaults::_InternalSerialize
          (FeatureSetDefaults *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  ulong uVar2;
  anon_union_40_1_493b367e_for_FeatureSetDefaults_3 aVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>_>
  *value;
  uint8_t *puVar4;
  int index;
  
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (index = 0; iVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
                      (&(this->field_0)._impl_.defaults_.super_RepeatedPtrFieldBase,index);
    target = internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  aVar3 = this->field_0;
  if (((undefined1  [40])aVar3 & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (4,(this->field_0)._impl_.minimum_edition_,puVar4);
  }
  if (((undefined1  [40])aVar3 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (5,(this->field_0)._impl_.maximum_edition_,puVar4);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FeatureSetDefaults::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FeatureSetDefaults& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FeatureSetDefaults)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault defaults = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_defaults_size());
       i < n; i++) {
    const auto& repfield = this_._internal_defaults().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.Edition minimum_edition = 4;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_minimum_edition(), target);
  }

  // optional .google.protobuf.Edition maximum_edition = 5;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_maximum_edition(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FeatureSetDefaults)
  return target;
}